

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

Configuration * rc::detail::anon_unknown_10::loadConfiguration(void)

{
  bool bVar1;
  result_type rVar2;
  result_type rVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  ostream *poVar4;
  Configuration *config_00;
  Configuration *in_RDI;
  string local_1480;
  ConfigurationException *e;
  allocator local_13f9;
  string local_13f8;
  undefined1 local_13d8 [8];
  Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> params;
  undefined1 local_13a0 [8];
  random_device device;
  Configuration *config;
  
  device.field_0.field2[4999] = 0;
  Configuration::Configuration(in_RDI);
  std::random_device::random_device((random_device *)local_13a0);
  rVar2 = std::random_device::operator()((random_device *)local_13a0);
  rVar3 = std::random_device::operator()((random_device *)local_13a0);
  (in_RDI->testParams).seed = CONCAT44(rVar2,rVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13f8,"RC_PARAMS",&local_13f9);
  getEnvValue((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_13d8,&local_13f8);
  std::__cxx11::string::~string((string *)&local_13f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
  bVar1 = rc::Maybe::operator_cast_to_bool((Maybe *)local_13d8);
  if (bVar1) {
    str = Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator*((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_13d8);
    configFromString((Configuration *)&e,str,in_RDI);
    Configuration::operator=(in_RDI,(Configuration *)&e);
    Configuration::~Configuration((Configuration *)&e);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Using configuration: ");
  configToMinimalString_abi_cxx11_(&local_1480,(detail *)in_RDI,config_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_1480);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1480);
  device.field_0.field2[4999] = 1;
  Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Maybe
            ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_13d8);
  std::random_device::~random_device((random_device *)local_13a0);
  if ((device.field_0.field2[4999] & 1) == 0) {
    Configuration::~Configuration(in_RDI);
  }
  return in_RDI;
}

Assistant:

Configuration loadConfiguration() {
  Configuration config;

  // Default to random seed
#ifdef RC_SEED_SYSTEM_TIME
  // See comment in CMakeLists.txt where RC_SEED_SYSTEM_TIME is set for the rationale here
  config.testParams.seed = static_cast<uint64_t>(std::time(nullptr));
#else
  std::random_device device;
  config.testParams.seed = (static_cast<uint64_t>(device()) << 32) | device();
#endif

  const auto params = getEnvValue("RC_PARAMS");
  if (params) {
    try {
      config = configFromString(*params, config);
    } catch (const ConfigurationException &e) {
      std::cerr << "Error parsing configuration: " << e.what() << std::endl;
      std::exit(1);
    }
  }

  // TODO rapidcheck logging framework ftw
  std::cerr << "Using configuration: " << configToMinimalString(config)
            << std::endl;
  return config;
}